

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

ScopedStmtBlock * __thiscall
kratos::SwitchStmt::add_switch_case
          (SwitchStmt *this,shared_ptr<kratos::Const> *switch_case,shared_ptr<kratos::Stmt> *stmt)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  element_type *peVar3;
  long lVar4;
  shared_ptr<kratos::Stmt> *psVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  element_type *this_00;
  _Rb_tree_node_base *p_Var7;
  shared_ptr<kratos::Stmt> *s;
  shared_ptr<kratos::Stmt> *stmt_00;
  undefined1 auStack_58 [8];
  shared_ptr<kratos::StmtBlock> blk;
  shared_ptr<kratos::ScopedStmtBlock> switch_stmt;
  
  peVar2 = (stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*(peVar2->super_IRNode)._vptr_IRNode[7])(peVar2,this);
  blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  switch_stmt.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var7 = (this->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->body_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    peVar3 = (switch_case->super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    do {
      lVar4 = *(long *)(p_Var7 + 1);
      if (peVar3 == (element_type *)0x0) {
        if (lVar4 == 0) goto LAB_001a416d;
      }
      else if ((lVar4 != 0) && (*(long *)(lVar4 + 0x270) == peVar3->value_)) {
LAB_001a416d:
        blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7[1]._M_left;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&switch_stmt,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var7[1]._M_right);
        if (blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001a41ec;
        break;
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  std::__shared_ptr<kratos::ScopedStmtBlock,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::ScopedStmtBlock>>
            ((__shared_ptr<kratos::ScopedStmtBlock,(__gnu_cxx::_Lock_policy)2> *)auStack_58,
             (allocator<kratos::ScopedStmtBlock> *)
             ((long)&switch_stmt.
                     super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  this_00 = switch_stmt.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  switch_stmt.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_58;
  auStack_58 = (undefined1  [8])0x0;
  blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  if ((this_00 != (element_type *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00),
     blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
     (element_type *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  (*(blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base[7])
            (blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             ,this);
  std::
  _Rb_tree<std::shared_ptr<kratos::Const>,std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>,std::_Select1st<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>,std::less<std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>>
  ::
  _M_emplace_unique<std::shared_ptr<kratos::Const>const&,std::shared_ptr<kratos::ScopedStmtBlock>&>
            ((_Rb_tree<std::shared_ptr<kratos::Const>,std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>,std::_Select1st<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>,std::less<std::shared_ptr<kratos::Const>>,std::allocator<std::pair<std::shared_ptr<kratos::Const>const,std::shared_ptr<kratos::ScopedStmtBlock>>>>
              *)&this->body_,switch_case,
             (shared_ptr<kratos::ScopedStmtBlock> *)
             &blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_001a41ec:
  if (((stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type_ == Block)
  {
    Stmt::as<kratos::StmtBlock>((Stmt *)auStack_58);
    psVar5 = *(shared_ptr<kratos::Stmt> **)
              &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)auStack_58 + 0xc0))->
               _M_use_count;
    for (stmt_00 = (shared_ptr<kratos::Stmt> *)
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)auStack_58 + 0xc0))->
                   _vptr__Sp_counted_base; stmt_00 != psVar5; stmt_00 = stmt_00 + 1) {
      StmtBlock::add_stmt((StmtBlock *)
                          blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,stmt_00);
    }
    if (blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  else {
    StmtBlock::add_stmt((StmtBlock *)
                        blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,stmt);
  }
  _Var6._M_pi = blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  if (switch_stmt.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               switch_stmt.super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
  }
  return (ScopedStmtBlock *)_Var6._M_pi;
}

Assistant:

ScopedStmtBlock &SwitchStmt::add_switch_case(const std::shared_ptr<Const> &switch_case,
                                             const std::shared_ptr<Stmt> &stmt) {
    stmt->set_parent(this);
    std::shared_ptr<ScopedStmtBlock> switch_stmt;
    for (auto const &[c, s] : body_) {
        if ((!switch_case && !c) || (switch_case && c && c->value() == switch_case->value())) {
            switch_stmt = s;
            break;
        }
    }
    if (!switch_stmt) {
        switch_stmt = std::make_shared<ScopedStmtBlock>();
        switch_stmt->set_parent(this);
        body_.emplace(switch_case, switch_stmt);
    }
    if (stmt->type() == StatementType::Block) {
        // merge the block
        auto blk = stmt->as<StmtBlock>();
        for (auto const &s : *blk) {
            switch_stmt->add_stmt(s);
        }
    } else {
        switch_stmt->add_stmt(stmt);
    }
    return *switch_stmt;
}